

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O2

ps_mgau_t * ptm_mgau_init(acmod_t *acmod,bin_mdef_t *mdef)

{
  feat_t *pfVar1;
  uint32 *puVar2;
  char cVar3;
  int iVar4;
  int32 iVar5;
  undefined4 uVar6;
  int iVar7;
  ps_mgau_t *ps;
  logmath_t *plVar8;
  char *pcVar9;
  char *pcVar10;
  gauden_t *pgVar11;
  FILE *pFVar12;
  size_t sVar13;
  float32 *vec;
  undefined4 extraout_var;
  mmio_file_t *mf;
  void *pvVar14;
  ps_mgaufuncs_t *ppVar15;
  long lVar16;
  long lVar17;
  FILE *pFVar18;
  ulong uVar19;
  err_lvl_t lvl;
  uint32 *puVar20;
  uint uVar21;
  ulong uVar22;
  acmod_t *paVar23;
  FILE *pFVar24;
  uint uVar25;
  long lVar26;
  size_t __n;
  float64 base;
  double dVar27;
  undefined8 in_stack_fffffffffffffb48;
  int32 r;
  FILE *local_488;
  char *local_480;
  int local_474;
  uint32 chksum;
  uint local_46c;
  FILE *local_468;
  char **argval;
  int local_454;
  double local_450;
  int32 n_sen;
  int32 n_feat;
  char eofchk;
  acmod_t *local_438;
  float64 local_430;
  ulong local_428;
  int32 n;
  char line [1000];
  
  ps = (ps_mgau_t *)
       __ckd_calloc__(1,0x78,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                      ,0x325);
  ps[1].vt = (ps_mgaufuncs_t *)acmod->config;
  plVar8 = logmath_retain(acmod->lmath);
  ps[7].vt = (ps_mgaufuncs_t *)plVar8;
  base = logmath_get_base(acmod->lmath);
  plVar8 = logmath_init(base,10,1);
  *(logmath_t **)&ps[6].frame_idx = plVar8;
  if (plVar8 == (logmath_t *)0x0) goto LAB_0013a387;
  iVar4 = logmath_get_width(plVar8);
  if (iVar4 != 1) {
    logmath_get_base(*(logmath_t **)&ps[6].frame_idx);
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
            ,0x330,"Log base %f is too small to represent add table in 8 bits\n");
    goto LAB_0013a387;
  }
  pcVar9 = ps_config_str((cmd_ln_t *)ps[1].vt,"mean");
  pcVar10 = ps_config_str((cmd_ln_t *)ps[1].vt,"var");
  dVar27 = ps_config_float((ps_config_t *)ps[1].vt,"varfloor");
  pgVar11 = gauden_init(pcVar9,pcVar10,(float32)(float)dVar27,(logmath_t *)ps[7].vt);
  *(gauden_t **)&ps[1].frame_idx = pgVar11;
  if (pgVar11 == (gauden_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
            ,0x339,"Failed to read means and variances\n");
    goto LAB_0013a387;
  }
  uVar21 = pgVar11->n_mgau;
  uVar22 = (ulong)uVar21;
  if (0x100 < (int)uVar21) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
            ,0x340,"Number of codebooks exceeds 256: %d\n");
    goto LAB_0013a387;
  }
  uVar19 = (ulong)(uint)mdef->n_ciphone;
  if (uVar21 == mdef->n_ciphone) {
    uVar21 = pgVar11->n_feat;
    uVar22 = (ulong)uVar21;
    pfVar1 = acmod->fcb;
    uVar25 = pfVar1->n_sv;
    if (uVar25 == 0) {
      uVar25 = pfVar1->n_stream;
    }
    uVar19 = (ulong)uVar25;
    if (uVar21 == uVar25) {
      puVar20 = &pfVar1->out_dim;
      uVar19 = 0;
      uVar22 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar22 = uVar19;
      }
      for (; uVar22 * 4 != uVar19; uVar19 = uVar19 + 4) {
        uVar21 = *(uint *)((long)pgVar11->featlen + uVar19);
        if (pfVar1->lda == (mfcc_t ***)0x0) {
          puVar2 = pfVar1->sv_len;
          if (puVar2 == (uint32 *)0x0) {
            if (uVar21 != *(uint *)((long)pfVar1->stream_len + uVar19)) {
              puVar20 = (uint32 *)(uVar19 + (long)pfVar1->stream_len);
              goto LAB_0013a364;
            }
          }
          else if (uVar21 != *(uint *)((long)puVar2 + uVar19)) {
            puVar20 = (uint32 *)((long)puVar2 + uVar19);
LAB_0013a364:
            uVar19 = (ulong)*puVar20;
            pcVar9 = "Dimension of stream %d does not match: %d != %d\n";
            lvl = ERR_ERROR;
            lVar16 = 0x350;
            uVar22 = (ulong)uVar21;
            goto LAB_0013a380;
          }
        }
        else if (uVar21 != *puVar20) goto LAB_0013a364;
      }
      pcVar9 = ps_config_str((cmd_ln_t *)ps[1].vt,"sendump");
      if (pcVar9 == (char *)0x0) {
        pcVar9 = ps_config_str((cmd_ln_t *)ps[1].vt,"mixw");
        local_450 = ps_config_float((ps_config_t *)ps[1].vt,"mixwfloor");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                ,0x29f,"Reading mixture weights file \'%s\'\n",pcVar9);
        local_480 = pcVar9;
        pFVar12 = fopen(pcVar9,"rb");
        if (pFVar12 == (FILE *)0x0) {
          err_msg_system(ERR_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                         ,0x2a2,"Failed to open mixture file \'%s\' for reading",local_480);
          goto LAB_0013a6ea;
        }
        local_468 = pFVar12;
        local_438 = acmod;
        iVar5 = bio_readhdr((FILE *)pFVar12,(char ***)line,&argval,&r);
        if (iVar5 < 0) {
          pcVar9 = "Failed to read header from \'%s\'\n";
          lVar16 = 0x2a6;
        }
        else {
          local_488 = (FILE *)((ulong)local_488 & 0xffffffff00000000);
          for (uVar22 = 0; pcVar9 = *(char **)(line._0_8_ + uVar22 * 8), pcVar9 != (char *)0x0;
              uVar22 = uVar22 + 1) {
            iVar4 = strcmp(pcVar9,"version");
            if (iVar4 == 0) {
              pcVar9 = argval[uVar22];
              iVar4 = strcmp(pcVar9,"1.0");
              if (iVar4 != 0) {
                in_stack_fffffffffffffb48 = 0;
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                        ,0x2ae,"Version mismatch(%s): %s, expecting %s\n",local_480,pcVar9,"1.0");
              }
            }
            else {
              iVar4 = strcmp(pcVar9,"chksum0");
              uVar6 = (int)local_488;
              if (iVar4 == 0) {
                uVar6 = 1;
              }
              local_488 = (FILE *)CONCAT44(local_488._4_4_,uVar6);
            }
          }
          bio_hdrarg_free((char **)line._0_8_,argval);
          pFVar12 = local_468;
          argval = (char **)0x0;
          line[0] = '\0';
          line[1] = '\0';
          line[2] = '\0';
          line[3] = '\0';
          line[4] = '\0';
          line[5] = '\0';
          line[6] = '\0';
          line[7] = '\0';
          chksum = 0;
          iVar5 = bio_fread(&n_sen,4,1,(FILE *)local_468,r,&chksum);
          if ((((iVar5 == 1) &&
               (iVar5 = bio_fread(&n_feat,4,1,(FILE *)pFVar12,r,&chksum), iVar5 == 1)) &&
              (iVar5 = bio_fread(&local_474,4,1,(FILE *)pFVar12,r,&chksum), iVar5 == 1)) &&
             (iVar5 = bio_fread(&n,4,1,(FILE *)pFVar12,r,&chksum), iVar5 == 1)) {
            lVar16 = *(long *)&ps[1].frame_idx;
            if (n_feat != *(int *)(lVar16 + 0x24)) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                      ,0x2c3,"#Features streams(%d) != %d\n");
              goto LAB_0013a6ea;
            }
            if (n != n_sen * n_feat * local_474) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                      ,0x2c7,"%s: #float32s(%d) doesn\'t match header dimensions: %d x %d x %d\n",
                      local_480,uVar22 & 0xffffffff,
                      CONCAT44((int)((ulong)in_stack_fffffffffffffb48 >> 0x20),n_sen),n_feat,
                      local_474);
              goto LAB_0013a6ea;
            }
            *(int32 *)&ps[2].vt = n_sen;
            ppVar15 = (ps_mgaufuncs_t *)
                      __ckd_calloc_3d__((long)n_feat,(long)*(int *)(lVar16 + 0x28),(long)n_sen,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                        ,0x2d1);
            ps[3].vt = ppVar15;
            vec = (float32 *)
                  __ckd_calloc__((long)local_474,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                 ,0x2d4);
            uVar21 = 0;
            for (lVar16 = 0; uVar6 = (undefined4)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                lVar16 < n_sen; lVar16 = lVar16 + 1) {
              for (lVar26 = 0; lVar26 < n_feat; lVar26 = lVar26 + 1) {
                local_46c = uVar21;
                iVar5 = bio_fread(vec,4,local_474,(FILE *)pFVar12,r,&chksum);
                if (iVar5 != local_474) {
                  pcVar9 = "bio_fread(%s) (arraydata) failed\n";
                  lVar16 = 0x2dc;
                  goto LAB_0013a6de;
                }
                local_430 = vector_sum_norm(vec,iVar5);
                vector_floor(vec,local_474,(float64)local_450);
                vector_sum_norm(vec,local_474);
                for (lVar17 = 0; lVar17 < local_474; lVar17 = lVar17 + 1) {
                  iVar4 = logmath_log(*(logmath_t **)&ps[6].frame_idx,
                                      (float64)(double)(float)vec[lVar17]);
                  cVar3 = -(char)iVar4;
                  if (iVar4 - 1U < 0xffffff60) {
                    cVar3 = -0x61;
                  }
                  *(char *)(*(long *)((&(ps[3].vt)->name)[lVar26] + lVar17 * 8) + lVar16) = cVar3;
                }
                uVar21 = (local_46c + 1) - (uint)(0.0 < (double)local_430);
                pFVar12 = local_468;
              }
            }
            if (0 < (int)uVar21) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                      ,0x2f1,"Weight normalization failed for %d mixture weights components\n");
            }
            ckd_free(vec);
            if ((int)local_488 != 0) {
              bio_verify_chksum((FILE *)pFVar12,r,chksum);
            }
            sVar13 = fread(&eofchk,1,1,pFVar12);
            paVar23 = local_438;
            if (sVar13 != 1) {
              fclose(pFVar12);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                      ,0x2fd,"Read %d x %d x %d mixture weights\n",(ulong)(uint)n_sen,
                      (ulong)(uint)n_feat,CONCAT44(uVar6,local_474));
              if (-1 < n_sen) {
LAB_0013a1f2:
                lVar16 = ps_config_int((cmd_ln_t *)ps[1].vt,"ds");
                *(short *)((long)&ps[4].frame_idx + 2) = (short)lVar16;
                lVar16 = ps_config_int((cmd_ln_t *)ps[1].vt,"topn");
                *(short *)&ps[4].frame_idx = (short)lVar16;
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                        ,0x362,"Maximum top-N: %d\n",(ulong)(uint)(int)(short)lVar16);
                pvVar14 = __ckd_calloc__((long)*(int *)&ps[2].vt,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                         ,0x366);
                *(void **)&ps[2].frame_idx = pvVar14;
                for (lVar16 = 0; lVar16 < *(int *)&ps[2].vt; lVar16 = lVar16 + 1) {
                  *(char *)(*(long *)&ps[2].frame_idx + lVar16) =
                       (char)paVar23->mdef->sen2cimap[lVar16];
                }
                lVar16 = ps_config_int((cmd_ln_t *)ps[1].vt,"pl_window");
                iVar4 = (int)lVar16 + 2;
                *(int *)&ps[6].vt = iVar4;
                ppVar15 = (ps_mgaufuncs_t *)
                          __ckd_calloc__((long)iVar4,0x10,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                         ,0x36e);
                ps[5].vt = ppVar15;
                *(ps_mgaufuncs_t **)&ps[5].frame_idx = ppVar15;
                ptm_mgau_reset_fast_hist(ps);
                ps->vt = &ptm_mgau_funcs;
                return ps;
              }
              goto LAB_0013a387;
            }
            pcVar9 = "More data than expected in %s\n";
            lVar16 = 0x2f9;
          }
          else {
            pcVar9 = "bio_fread(%s) (arraysize) failed\n";
            lVar16 = 0x2c0;
          }
        }
LAB_0013a6de:
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                ,lVar16,pcVar9,local_480);
LAB_0013a6ea:
        exit(1);
      }
      pFVar24 = (FILE *)(ulong)*(uint *)(*(long *)&ps[1].frame_idx + 0x24);
      local_46c = *(uint *)(*(long *)&ps[1].frame_idx + 0x28);
      iVar5 = acmod->mdef->n_sen;
      *(int32 *)&ps[2].vt = iVar5;
      iVar4 = ps_config_bool((ps_config_t *)ps[1].vt,"mmap");
      local_430 = (float64)CONCAT44(local_430._4_4_,iVar4);
      pFVar12 = fopen(pcVar9,"rb");
      if (pFVar12 == (FILE *)0x0) goto LAB_0013a387;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
              ,0x1dc,"Loading senones from dump file %s\n",pcVar9);
      sVar13 = fread(&argval,4,1,pFVar12);
      if (sVar13 != 1) {
        pcVar10 = "Failed to read title size from %s";
        lVar16 = 0x1df;
        goto LAB_0013a2f3;
      }
      uVar21 = (uint)argval - 1;
      uVar25 = (uint)argval;
      local_468 = pFVar24;
      if (uVar21 < 999) {
LAB_0013a302:
        local_450 = (double)CONCAT44(local_450._4_4_,uVar21);
        local_438 = acmod;
        sVar13 = fread(line,1,(ulong)uVar25,pFVar12);
        if (sVar13 == uVar25) {
          if (line[uVar25 - 1] == '\0') {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                    ,500,"%s\n",line);
            sVar13 = fread(&argval,4,1,pFVar12);
            if (sVar13 == 1) {
              uVar21 = local_450._0_4_;
              uVar25 = (uint)argval;
              if (0x3e6 < local_450._0_4_) {
                uVar25 = (uint)argval >> 0x18 | ((uint)argval & 0xff0000) >> 8 |
                         ((uint)argval & 0xff00) << 8 | (uint)argval << 0x18;
                argval = (char **)CONCAT44(argval._4_4_,uVar25);
              }
              __n = (size_t)(int)uVar25;
              sVar13 = fread(line,1,__n,pFVar12);
              if (sVar13 != __n) {
                pcVar9 = "Cannot read header";
                lVar16 = 0x1fd;
                goto LAB_0013a3bc;
              }
              local_450 = (double)CONCAT44(local_450._4_4_,iVar5);
              if (line[__n - 1] != '\0') {
                pcVar9 = "Bad header in dump file\n";
                lVar16 = 0x201;
                goto LAB_0013a354;
              }
              local_454 = 8;
              local_480 = (char *)((ulong)local_480 & 0xffffffff00000000);
              local_488 = pFVar12;
              while (sVar13 = fread(&argval,4,1,pFVar12), sVar13 == 1) {
                uVar25 = (uint)argval;
                if (0x3e6 < uVar21) {
                  uVar25 = (uint)argval >> 0x18 | ((uint)argval & 0xff0000) >> 8 |
                           ((uint)argval & 0xff00) << 8 | (uint)argval << 0x18;
                  argval = (char **)CONCAT44(argval._4_4_,uVar25);
                }
                if (uVar25 == 0) {
                  chksum = local_450._0_4_;
                  local_428 = (ulong)local_46c;
                  r = local_46c;
                  uVar22 = (ulong)local_450 & 0xffffffff;
                  if ((int)local_480 == 0) {
                    sVar13 = fread(&r,4,1,local_488);
                    if (sVar13 == 1) {
                      if (0x3e6 < uVar21) {
                        r = (uint)r >> 0x18 | (r & 0xff0000U) >> 8 | (r & 0xff00U) << 8 | r << 0x18;
                      }
                      sVar13 = fread(&chksum,4,1,local_488);
                      if (sVar13 == 1) {
                        uVar25 = chksum >> 0x18 | (chksum & 0xff0000) >> 8 | (chksum & 0xff00) << 8
                                 | chksum << 0x18;
                        if (uVar21 < 999) {
                          uVar25 = chksum;
                        }
                        uVar22 = (ulong)uVar25;
                        local_428 = (ulong)(uint)r;
                        err_msg(ERR_INFO,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                ,0x233,"Rows: %d, Columns: %d\n");
                        goto LAB_0013a62f;
                      }
                      pcVar9 = "Cannot read #columns";
                      lVar16 = 0x22f;
                    }
                    else {
                      pcVar9 = "Cannot read #rows";
                      lVar16 = 0x22a;
                    }
LAB_0013a6bc:
                    err_msg_system(ERR_ERROR,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                   ,lVar16,pcVar9);
                    pFVar12 = local_488;
                  }
                  else {
LAB_0013a62f:
                    if ((int)local_468 == *(int *)(*(long *)&ps[1].frame_idx + 0x24)) {
                      if (local_46c != *(uint *)(*(long *)&ps[1].frame_idx + 0x28)) {
                        pcVar9 = "Number of densities mismatch: %d != %d\n";
                        lVar16 = 0x23d;
                        pFVar12 = (FILE *)(ulong)local_46c;
                        goto LAB_0013a815;
                      }
                      if (local_450._0_4_ != *(int *)&ps[2].vt) {
                        pcVar9 = "Number of senones mismatch: %d != %d\n";
                        lVar16 = 0x242;
                        pFVar12 = (FILE *)((ulong)local_450 & 0xffffffff);
                        goto LAB_0013a815;
                      }
                      if ((int)local_480 == 0) {
LAB_0013a82d:
                        if ((local_454 != 4) && (local_454 != 8)) {
                          pcVar9 = "Cluster count must be 4 or 8\n";
                          lVar16 = 0x24e;
                          goto LAB_0013a8c8;
                        }
                        if (local_430._0_4_ != 0) {
                          err_msg(ERR_INFO,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                  ,0x253,"Using memory-mapped I/O for senones\n");
                        }
                        lVar16 = ftell(local_488);
                        if (local_430._0_4_ != 0) {
                          mf = mmio_file_read(pcVar9);
                          *(mmio_file_t **)&ps[3].frame_idx = mf;
                          if ((int)local_480 != 0) {
                            pvVar14 = mmio_file_ptr(mf);
                            ps[4].vt = (ps_mgaufuncs_t *)((long)pvVar14 + lVar16);
                            lVar16 = lVar16 + ((ulong)local_480 & 0xffffffff);
                          }
LAB_0013a920:
                          iVar4 = (int)uVar22;
                          if (*(long *)&ps[3].frame_idx == 0) {
                            ppVar15 = (ps_mgaufuncs_t *)
                                      __ckd_calloc_3d__((long)(int)local_468,(long)(int)local_46c,
                                                        (long)(int)local_450._0_4_,1,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                                  ,0x279);
                            pFVar24 = (FILE *)0x0;
                            pFVar12 = (FILE *)(local_428 & 0xffffffff);
                            if ((int)local_428 < 1) {
                              pFVar12 = pFVar24;
                            }
                            iVar7 = (int)local_468;
                            local_468 = (FILE *)((ulong)local_468 & 0xffffffff);
                            if (iVar7 < 1) {
                              local_468 = pFVar24;
                            }
                            ps[3].vt = ppVar15;
                            uVar19 = (long)(iVar4 + 1) / 2 & 0xffffffff;
                            if (local_454 != 4) {
                              uVar19 = uVar22;
                            }
                            for (; pFVar24 != local_468;
                                pFVar24 = (FILE *)((long)&pFVar24->_flags + 1)) {
                              pFVar18 = (FILE *)0x0;
                              while (pFVar12 != pFVar18) {
                                sVar13 = fread(*(void **)((&(ps[3].vt)->name)[(long)pFVar24] +
                                                         (long)pFVar18 * 8),1,(long)(int)uVar19,
                                               local_488);
                                pFVar18 = (FILE *)((long)&pFVar18->_flags + 1);
                                if (sVar13 != (long)(int)uVar19) {
                                  lVar16 = 0x282;
                                  goto LAB_0013aac8;
                                }
                              }
                            }
                          }
                          else {
                            ppVar15 = (ps_mgaufuncs_t *)
                                      __ckd_calloc_2d__((long)(int)local_468,(long)(int)local_46c,8,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                                  ,0x26d);
                            pFVar24 = (FILE *)0x0;
                            pFVar12 = (FILE *)(local_428 & 0xffffffff);
                            if ((int)local_428 < 1) {
                              pFVar12 = pFVar24;
                            }
                            iVar7 = (int)local_468;
                            local_468 = (FILE *)((ulong)local_468 & 0xffffffff);
                            if (iVar7 < 1) {
                              local_468 = pFVar24;
                            }
                            ps[3].vt = ppVar15;
                            iVar7 = (iVar4 + 1) / 2;
                            if (local_454 != 4) {
                              iVar7 = iVar4;
                            }
                            for (; pFVar24 != local_468;
                                pFVar24 = (FILE *)((long)&pFVar24->_flags + 1)) {
                              for (pFVar18 = (FILE *)0x0; pFVar12 != pFVar18;
                                  pFVar18 = (FILE *)((long)&pFVar18->_flags + 1)) {
                                pvVar14 = mmio_file_ptr(*(mmio_file_t **)&ps[3].frame_idx);
                                *(long *)((&(ps[3].vt)->name)[(long)pFVar24] + (long)pFVar18 * 8) =
                                     (long)pvVar14 + lVar16;
                                lVar16 = lVar16 + iVar7;
                              }
                            }
                          }
                          fclose(local_488);
                          paVar23 = local_438;
                          goto LAB_0013a1f2;
                        }
                        if ((int)local_480 == 0) goto LAB_0013a920;
                        uVar19 = (ulong)local_480 & 0xffffffff;
                        ppVar15 = (ps_mgaufuncs_t *)
                                  __ckd_calloc__(1,uVar19,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                                 ,0x263);
                        ps[4].vt = ppVar15;
                        sVar13 = fread(ppVar15,1,uVar19,local_488);
                        if (sVar13 == uVar19) goto LAB_0013a920;
                        lVar16 = 0x265;
                        uVar19 = (ulong)local_480 & 0xffffffff;
LAB_0013aac8:
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                ,lVar16,"Failed to read %d bytes from sendump\n",uVar19);
                        pFVar12 = local_488;
                      }
                      else {
                        if ((int)local_480 == 0xf) {
                          local_480 = (char *)CONCAT44(local_480._4_4_,0x10);
                          goto LAB_0013a82d;
                        }
                        if ((int)local_480 == 0x10) goto LAB_0013a82d;
                        pcVar9 = "Cluster count must be 0, 15, or 16\n";
                        lVar16 = 0x247;
LAB_0013a8c8:
                        err_msg(ERR_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                                ,lVar16,pcVar9);
                        pFVar12 = local_488;
                      }
                    }
                    else {
                      pcVar9 = "Number of feature streams mismatch: %d != %d\n";
                      lVar16 = 0x238;
                      pFVar12 = local_468;
LAB_0013a815:
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                              ,lVar16,pcVar9,pFVar12);
                      pFVar12 = local_488;
                    }
                  }
                  goto LAB_0013a3c3;
                }
                sVar13 = fread(line,1,(long)(int)uVar25,local_488);
                if (sVar13 != (long)(int)uVar25) {
                  pcVar9 = "Cannot read header";
                  lVar16 = 0x20f;
                  goto LAB_0013a6bc;
                }
                iVar4 = bcmp(line,"feature_count ",0xe);
                if (iVar4 == 0) {
                  iVar4 = atoi(line + 0xe);
                  local_468 = (FILE *)CONCAT44(extraout_var,iVar4);
                }
                iVar4 = bcmp(line,"mixture_count ",0xe);
                pFVar12 = local_488;
                if (iVar4 == 0) {
                  local_46c = atoi(line + 0xe);
                }
                iVar4 = bcmp(line,"model_count ",0xc);
                if (iVar4 == 0) {
                  iVar4 = atoi(line + 0xc);
                  local_450 = (double)CONCAT44(local_450._4_4_,iVar4);
                }
                iVar4 = bcmp(line,"cluster_count ",0xe);
                if (iVar4 == 0) {
                  iVar4 = atoi(line + 0xe);
                  local_480 = (char *)CONCAT44(local_480._4_4_,iVar4);
                }
                iVar4 = bcmp(line,"cluster_bits ",0xd);
                if (iVar4 == 0) {
                  local_454 = atoi(line + 0xd);
                }
              }
              pcVar10 = "Failed to read header string size from %s";
              lVar16 = 0x208;
            }
            else {
              pcVar10 = "Failed to read header size from %s";
              lVar16 = 0x1f8;
            }
LAB_0013a2f3:
            err_msg_system(ERR_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                           ,lVar16,pcVar10,pcVar9);
          }
          else {
            pcVar9 = "Bad title in dump file\n";
            lVar16 = 0x1f1;
LAB_0013a354:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                    ,lVar16,pcVar9);
          }
        }
        else {
          pcVar9 = "Cannot read title";
          lVar16 = 0x1ed;
LAB_0013a3bc:
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                         ,lVar16,pcVar9);
        }
      }
      else {
        uVar25 = (uint)argval >> 0x18 | ((uint)argval & 0xff0000) >> 8 |
                 ((uint)argval & 0xff00) << 8 | (uint)argval << 0x18;
        argval = (char **)CONCAT44(argval._4_4_,uVar25);
        if (0xfffffc18 < uVar25 - 1000) goto LAB_0013a302;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
                ,0x1e7,"Title length %x in dump file %s out of range\n",(ulong)uVar25,pcVar9);
      }
LAB_0013a3c3:
      fclose(pFVar12);
      goto LAB_0013a387;
    }
    pcVar9 = "Number of streams does not match: %d != %d\n";
    lvl = ERR_ERROR;
    lVar16 = 0x34a;
  }
  else {
    pcVar9 = 
    "Number of codebooks doesn\'t match number of ciphones, doesn\'t look like PTM: %d != %d\n";
    lvl = ERR_INFO;
    lVar16 = 0x344;
  }
LAB_0013a380:
  err_msg(lvl,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ptm_mgau.c"
          ,lVar16,pcVar9,uVar22,uVar19);
LAB_0013a387:
  ptm_mgau_free(ps);
  return (ps_mgau_t *)0x0;
}

Assistant:

ps_mgau_t *
ptm_mgau_init(acmod_t *acmod, bin_mdef_t *mdef)
{
    ptm_mgau_t *s;
    ps_mgau_t *ps;
    char const *sendump_path;
    int i;

    s = ckd_calloc(1, sizeof(*s));
    s->config = acmod->config;

    s->lmath = logmath_retain(acmod->lmath);
    /* Log-add table. */
    s->lmath_8b = logmath_init(logmath_get_base(acmod->lmath), SENSCR_SHIFT, TRUE);
    if (s->lmath_8b == NULL)
        goto error_out;
    /* Ensure that it is only 8 bits wide so that fast_logmath_add() works. */
    if (logmath_get_width(s->lmath_8b) != 1) {
        E_ERROR("Log base %f is too small to represent add table in 8 bits\n",
                logmath_get_base(s->lmath_8b));
        goto error_out;
    }

    /* Read means and variances. */
    if ((s->g = gauden_init(ps_config_str(s->config, "mean"),
                            ps_config_str(s->config, "var"),
                            ps_config_float(s->config, "varfloor"),
                            s->lmath)) == NULL) {
        E_ERROR("Failed to read means and variances\n");	
        goto error_out;
    }

    /* We only support 256 codebooks or less (like 640k or 2GB, this
     * should be enough for anyone) */
    if (s->g->n_mgau > 256) {
        E_INFO("Number of codebooks exceeds 256: %d\n", s->g->n_mgau);
        goto error_out;
    }
    if (s->g->n_mgau != bin_mdef_n_ciphone(mdef)) {
        E_INFO("Number of codebooks doesn't match number of ciphones, doesn't look like PTM: %d != %d\n", s->g->n_mgau, bin_mdef_n_ciphone(mdef));
        goto error_out;
    }
    /* Verify n_feat and veclen, against acmod. */
    if (s->g->n_feat != feat_dimension1(acmod->fcb)) {
        E_ERROR("Number of streams does not match: %d != %d\n",
                s->g->n_feat, feat_dimension1(acmod->fcb));
        goto error_out;
    }
    for (i = 0; i < s->g->n_feat; ++i) {
        if ((uint32)s->g->featlen[i] != feat_dimension2(acmod->fcb, i)) {
            E_ERROR("Dimension of stream %d does not match: %d != %d\n",
                    s->g->featlen[i], feat_dimension2(acmod->fcb, i));
            goto error_out;
        }
    }
    /* Read mixture weights. */
    if ((sendump_path = ps_config_str(s->config, "sendump"))) {
        if (read_sendump(s, acmod->mdef, sendump_path) < 0) {
            goto error_out;
        }
    }
    else {
        if (read_mixw(s, ps_config_str(s->config, "mixw"),
                      ps_config_float(s->config, "mixwfloor")) < 0) {
            goto error_out;
        }
    }
    s->ds_ratio = ps_config_int(s->config, "ds");
    s->max_topn = ps_config_int(s->config, "topn");
    E_INFO("Maximum top-N: %d\n", s->max_topn);

    /* Assume mapping of senones to their base phones, though this
     * will become more flexible in the future. */
    s->sen2cb = ckd_calloc(s->n_sen, sizeof(*s->sen2cb));
    for (i = 0; i < s->n_sen; ++i)
        s->sen2cb[i] = bin_mdef_sen2cimap(acmod->mdef, i);

    /* Allocate fast-match history buffers.  We need enough for the
     * phoneme lookahead window, plus the current frame, plus one for
     * good measure? (FIXME: I don't remember why) */
    s->n_fast_hist = ps_config_int(s->config, "pl_window") + 2;
    s->hist = ckd_calloc(s->n_fast_hist, sizeof(*s->hist));
    /* s->f will be a rotating pointer into s->hist. */
    s->f = s->hist;

    ps = (ps_mgau_t *)s;
    ptm_mgau_reset_fast_hist(ps);
    ps->vt = &ptm_mgau_funcs;
    return ps;
error_out:
    ptm_mgau_free(ps_mgau_base(s));
    return NULL;
}